

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

void __thiscall sf::Shader::setUniform(Shader *this,string *name,Texture *texture)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr *pp_Var3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  TransientContextLock lock;
  int location;
  TransientContextLock local_2d;
  int local_2c;
  Lock local_28;
  
  if (this->m_shaderProgram == 0) {
    return;
  }
  GlResource::TransientContextLock::TransientContextLock(&local_2d);
  local_2c = getUniformLocation(this,name);
  if (local_2c == -1) goto LAB_0012e142;
  p_Var6 = (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_0012e07e:
    Lock::Lock(&local_28,(Mutex *)&(anonymous_namespace)::maxTextureUnitsMutex);
    if (((anonymous_namespace)::getMaxTextureUnits()::maxUnits == '\0') &&
       (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits),
       iVar2 != 0)) {
      (anonymous_namespace)::getMaxTextureUnits()::maxUnits =
           anon_unknown.dwarf_8a34d::checkMaxTextureUnits();
      __cxa_guard_release(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits);
    }
    uVar7 = (ulong)(anonymous_namespace)::getMaxTextureUnits()::maxUnits;
    Lock::~Lock(&local_28);
    if (uVar7 <= (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
      poVar4 = err();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Impossible to use texture \"",0x1b)
      ;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\" for shader: all available texture units are used",0x32);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      goto LAB_0012e142;
    }
    pp_Var3 = (_Base_ptr *)
              std::
              map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
              ::operator[](&this->m_textures,&local_2c);
  }
  else {
    p_Var1 = &(this->m_textures)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (local_2c <= (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < local_2c];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) || (local_2c < (int)p_Var5[1]._M_color))
    goto LAB_0012e07e;
    pp_Var3 = &p_Var5[1]._M_parent;
  }
  *pp_Var3 = (_Base_ptr)texture;
LAB_0012e142:
  GlResource::TransientContextLock::~TransientContextLock(&local_2d);
  return;
}

Assistant:

void Shader::setUniform(const std::string& name, const Texture& texture)
{
    if (m_shaderProgram)
    {
        TransientContextLock lock;

        // Find the location of the variable in the shader
        int location = getUniformLocation(name);
        if (location != -1)
        {
            // Store the location -> texture mapping
            TextureTable::iterator it = m_textures.find(location);
            if (it == m_textures.end())
            {
                // New entry, make sure there are enough texture units
                GLint maxUnits = getMaxTextureUnits();
                if (m_textures.size() + 1 >= static_cast<std::size_t>(maxUnits))
                {
                    err() << "Impossible to use texture \"" << name << "\" for shader: all available texture units are used" << std::endl;
                    return;
                }

                m_textures[location] = &texture;
            }
            else
            {
                // Location already used, just replace the texture
                it->second = &texture;
            }
        }
    }
}